

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdGetAddr(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg2;
  x86Reg reg1;
  uint uVar1;
  
  uVar1 = cmd._3_4_ & 0xff;
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  if (uVar1 == 2) {
    reg2 = rR14;
  }
  else {
    if (uVar1 != 1) {
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,uVar1 << 3);
      EMIT_OP_REG_NUM(&ctx->ctx,o_add64,reg1,cmd.argument);
      goto LAB_0027eb1e;
    }
    reg2 = rR15;
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,reg1,sQWORD,reg2,cmd.argument);
LAB_0027eb1e:
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,reg1);
  return;
}

Assistant:

void GenCodeCmdGetAddr(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg targetReg = ctx.ctx.GetReg();

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sQWORD, rR15, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else if(cmd.rC == rvrrConstants)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sQWORD, rR14, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, cmd.rC * 8); // Load source pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_add64, targetReg, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
#else
	x86Reg targetReg = ctx.ctx.GetReg();

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sDWORD, rESI, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, cmd.rC * 8); // Load source pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_add, targetReg, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
#endif
}